

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffghpr(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,long *naxes,long *pcount,
          long *gcount,int *extend,int *status)

{
  ulong uVar1;
  int idummy;
  double ddummy;
  LONGLONG lldummy;
  LONGLONG tnaxes [99];
  int local_34c;
  double local_348;
  LONGLONG local_340;
  LONGLONG local_338 [99];
  
  uVar1 = (ulong)(uint)maxdim;
  ffgphd(fptr,maxdim,simple,bitpix,naxis,local_338,pcount,gcount,extend,&local_348,&local_348,
         &local_340,&local_34c,status);
  if (naxes == (long *)0x0 || naxis == (int *)0x0) {
    if (maxdim < 1 || naxes == (long *)0x0) goto LAB_00170911;
  }
  else {
    if (*naxis <= maxdim) {
      uVar1 = (ulong)(uint)*naxis;
    }
    if ((int)uVar1 < 1) goto LAB_00170911;
  }
  memcpy(naxes,local_338,uVar1 << 3);
LAB_00170911:
  return *status;
}

Assistant:

int ffghpr(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           long naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the PRimary array:
  Check that the keywords conform to the FITS standard and return the
  parameters which determine the size and structure of the primary array
  or IMAGE extension.
*/
{
    int idummy, ii;
    LONGLONG lldummy;
    double ddummy;
    LONGLONG tnaxes[99];

    ffgphd(fptr, maxdim, simple, bitpix, naxis, tnaxes, pcount, gcount, extend,
          &ddummy, &ddummy, &lldummy, &idummy, status);
	  
    if (naxis && naxes) {
         for (ii = 0; (ii < *naxis) && (ii < maxdim); ii++)
	     naxes[ii] = (long) tnaxes[ii];
    } else if (naxes) {
         for (ii = 0; ii < maxdim; ii++)
	     naxes[ii] = (long) tnaxes[ii];
    }

    return(*status);
}